

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_argtype(lua_State *L,int narg,char *xname)

{
  int iVar1;
  ulong uVar2;
  char *msg_00;
  char *local_68;
  uint local_5c;
  TValue *local_58;
  uint local_4c;
  TValue *o;
  int idx;
  GCfunc *fn;
  char *msg;
  char *tname;
  char *xname_local;
  int narg_local;
  lua_State *L_local;
  
  if (narg < -9999) {
    if (narg < -0x2712) {
      uVar2 = L->base[-2].u64 & 0x7fffffffffff;
      iVar1 = -narg;
      if ((int)(uint)*(byte *)(uVar2 + 0xb) < iVar1 + -0x2712) {
        msg = "no value";
      }
      else {
        if ((uint)((long)*(undefined8 *)(uVar2 + 0x30 + (long)(iVar1 + -0x2713) * 8) >> 0x2f) <
            0xfffffff3) {
          local_4c = 0xd;
        }
        else {
          local_4c = (uint)((long)*(undefined8 *)(uVar2 + 0x30 + (long)(iVar1 + -0x2713) * 8) >>
                           0x2f) ^ 0xffffffff;
        }
        msg = lj_obj_itypename[local_4c];
      }
    }
    else {
      msg = "table";
    }
  }
  else {
    if (narg < 0) {
      local_58 = L->top + narg;
    }
    else {
      local_58 = L->base + (long)narg + -1;
    }
    if (local_58 < L->top) {
      if ((uint)((int)(local_58->field_4).it >> 0xf) < 0xfffffff3) {
        local_5c = 0xd;
      }
      else {
        local_5c = (int)(local_58->field_4).it >> 0xf ^ 0xffffffff;
      }
      local_68 = lj_obj_itypename[local_5c];
    }
    else {
      local_68 = "no value";
    }
    msg = local_68;
  }
  msg_00 = lj_strfmt_pushf(L,lj_err_allmsg + 0x205,xname,msg);
  err_argmsg(L,narg,msg_00);
}

Assistant:

LJ_NOINLINE void lj_err_argtype(lua_State *L, int narg, const char *xname)
{
  const char *tname, *msg;
  if (narg <= LUA_REGISTRYINDEX) {
    if (narg >= LUA_GLOBALSINDEX) {
      tname = lj_obj_itypename[~LJ_TTAB];
    } else {
      GCfunc *fn = curr_func(L);
      int idx = LUA_GLOBALSINDEX - narg;
      if (idx <= fn->c.nupvalues)
	tname = lj_typename(&fn->c.upvalue[idx-1]);
      else
	tname = lj_obj_typename[0];
    }
  } else {
    TValue *o = narg < 0 ? L->top + narg : L->base + narg-1;
    tname = o < L->top ? lj_typename(o) : lj_obj_typename[0];
  }
  msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADTYPE), xname, tname);
  err_argmsg(L, narg, msg);
}